

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall
duckdb_parquet::DictionaryPageHeader::printTo(DictionaryPageHeader *this,ostream *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _DictionaryPageHeader__isset _Var2;
  type *val;
  string local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"DictionaryPageHeader(",0x15);
  std::__ostream_insert<char,std::char_traits<char>>(out,"num_values=",0xb);
  duckdb_apache::thrift::to_string<int>(&local_48,&this->num_values);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_48._M_dataplus._M_p,local_48._M_string_length);
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"encoding=",9);
  to_string_abi_cxx11_(&local_48,(duckdb_parquet *)&this->encoding,val);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_48._M_dataplus._M_p,local_48._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"is_sorted=",10);
  _Var2 = this->__isset;
  if (((byte)_Var2 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<bool>(&local_48,&this->is_sorted);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_48._M_dataplus._M_p,local_48._M_string_length);
  }
  if ((((byte)_Var2 & 1) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1)) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  return;
}

Assistant:

void DictionaryPageHeader::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "DictionaryPageHeader(";
  out << "num_values=" << to_string(num_values);
  out << ", " << "encoding=" << to_string(encoding);
  out << ", " << "is_sorted="; (__isset.is_sorted ? (out << to_string(is_sorted)) : (out << "<null>"));
  out << ")";
}